

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O2

storage_holder __thiscall
libtorrent::mmap_disk_io::new_torrent
          (mmap_disk_io *this,storage_params *params,shared_ptr<void> *owner)

{
  storage_index_t sVar1;
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *in_RCX;
  undefined8 extraout_RDX;
  storage_holder sVar2;
  shared_ptr<libtorrent::aux::mmap_storage> storage;
  shared_ptr<libtorrent::aux::mmap_storage> local_48;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  ::std::
  make_shared<libtorrent::aux::mmap_storage,libtorrent::storage_params_const&,libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>&>
            ((storage_params *)&stack0xffffffffffffffc8,
             (file_pool_impl<libtorrent::aux::file_view_entry> *)owner);
  ::std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(local_38->m_torrent).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>,in_RCX);
  local_48.super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38;
  local_48.super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Stack_30._M_pi;
  local_38 = (element_type *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar1 = aux::storage_array<libtorrent::aux::mmap_storage>::add
                    ((storage_array<libtorrent::aux::mmap_storage> *)&params[0xb].info_hash,
                     &local_48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  (this->super_disk_interface)._vptr_disk_interface = (_func_int **)params;
  *(uint *)&this->m_abort = sVar1.m_val;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffd0);
  sVar2._8_8_ = extraout_RDX;
  sVar2.m_disk_io = &this->super_disk_interface;
  return sVar2;
}

Assistant:

storage_holder mmap_disk_io::new_torrent(storage_params const& params
		, std::shared_ptr<void> const& owner)
	{
		TORRENT_ASSERT(params.files.is_valid());

		auto storage = std::make_shared<aux::mmap_storage>(params, m_file_pool);
		storage->set_owner(owner);
		storage_index_t const idx = m_torrents.add(std::move(storage));
		return storage_holder(idx, *this);
	}